

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O2

Nwk_Man_t *
Nwk_ManCreateFromGia
          (Gia_Man_t *p,Vec_Int_t *vPPis,Vec_Int_t *vNodes,Vec_Int_t *vLeaves,Vec_Int_t **pvMapInv)

{
  int iVar1;
  Nwk_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *p_01;
  undefined8 *__ptr;
  Nwk_Obj_t *pNVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  
  Gia_ManCreateRefs(p);
  iVar6 = 0;
  p_00 = Nwk_ManAlloc();
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  p_00->nFanioPlus = 0;
  Hop_ManStop(p_00->pManHop);
  p_00->pManHop = (Hop_Man_t *)0x0;
  iVar1 = vLeaves->nSize;
  if (vLeaves->nSize < vPPis->nSize) {
    iVar1 = vPPis->nSize;
  }
  p_01 = Vec_IntAlloc(vNodes->nSize + iVar1 + 1);
  __ptr = (undefined8 *)malloc((long)p->nObjs << 3);
  pGVar4 = p->pObjs;
  iVar1 = Gia_ObjRefNum(p,pGVar4);
  iVar5 = vLeaves->nSize - vPPis->nSize;
  if (iVar5 == 0 || vLeaves->nSize < vPPis->nSize) {
    iVar5 = 0;
  }
  pNVar3 = Nwk_ManCreateNode(p_00,0,iVar5 + iVar1);
  iVar1 = Gia_ObjId(p,pGVar4);
  __ptr[iVar1] = pNVar3;
  iVar1 = Gia_ObjId(p,pGVar4);
  Vec_IntPush(p_01,iVar1);
  for (; iVar1 = vLeaves->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vLeaves,iVar6);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar1 = vLeaves->nSize;
      break;
    }
    iVar1 = Gia_ObjRefNum(p,pGVar4);
    pNVar3 = Nwk_ManCreateCi(p_00,iVar1);
    iVar1 = Gia_ObjId(p,pGVar4);
    __ptr[iVar1] = pNVar3;
    iVar1 = p_01->nSize;
    iVar5 = Gia_ObjId(p,pGVar4);
    if (iVar1 != *(int *)(__ptr[iVar5] + 0x24)) {
      __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xb1,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    iVar1 = Gia_ObjId(p,pGVar4);
    Vec_IntPush(p_01,iVar1);
  }
  for (; iVar1 < vPPis->nSize; iVar1 = iVar1 + 1) {
    Nwk_ManCreateCi(p_00,0);
    Vec_IntPush(p_01,-1);
  }
  for (iVar1 = 0; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
    iVar6 = Vec_IntEntry(vNodes,iVar1);
    pGVar4 = Gia_ManObj(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjRefNum(p,pGVar4);
    pNVar3 = Nwk_ManCreateNode(p_00,2,iVar6);
    iVar6 = Gia_ObjId(p,pGVar4);
    __ptr[iVar6] = pNVar3;
    iVar6 = Gia_ObjId(p,pGVar4);
    pNVar3 = (Nwk_Obj_t *)__ptr[iVar6];
    iVar6 = Gia_ObjId(p,pGVar4);
    Nwk_ObjAddFanin(pNVar3,(Nwk_Obj_t *)__ptr[(int)(iVar6 - (*(uint *)pGVar4 & 0x1fffffff))]);
    iVar6 = Gia_ObjId(p,pGVar4);
    pNVar3 = (Nwk_Obj_t *)__ptr[iVar6];
    iVar6 = Gia_ObjId(p,pGVar4);
    Nwk_ObjAddFanin(pNVar3,(Nwk_Obj_t *)
                           __ptr[(int)(iVar6 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff))]);
    iVar6 = p_01->nSize;
    iVar5 = Gia_ObjId(p,pGVar4);
    if (iVar6 != *(int *)(__ptr[iVar5] + 0x24)) {
      __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xbe,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    iVar6 = Gia_ObjId(p,pGVar4);
    Vec_IntPush(p_01,iVar6);
  }
  iVar1 = 0;
  do {
    iVar6 = vPPis->nSize;
    if (iVar6 <= iVar1) {
LAB_003ed32c:
      for (; iVar1 = vLeaves->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
        pNVar3 = Nwk_ManCreateCo(p_00);
        Nwk_ObjAddFanin(pNVar3,(Nwk_Obj_t *)*__ptr);
      }
      if (iVar1 < vPPis->nSize) {
        iVar1 = vPPis->nSize;
      }
      if (p_01->nSize != iVar1 + vNodes->nSize + 1) {
        __assert_fail("Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                      ,200,
                      "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      free(__ptr);
      *pvMapInv = p_01;
      return p_00;
    }
    iVar6 = Vec_IntEntry(vPPis,iVar1);
    pGVar4 = Gia_ManObj(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar6 = vPPis->nSize;
      goto LAB_003ed32c;
    }
    iVar6 = Gia_ObjId(p,pGVar4);
    if (__ptr[iVar6] == 0) {
      __assert_fail("ppCopies[Gia_ObjId(p,pObj)] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xc3,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    pNVar3 = Nwk_ManCreateCo(p_00);
    iVar6 = Gia_ObjId(p,pGVar4);
    Nwk_ObjAddFanin(pNVar3,(Nwk_Obj_t *)__ptr[iVar6]);
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Nwk_Man_t * Nwk_ManCreateFromGia( Gia_Man_t * p, Vec_Int_t * vPPis, Vec_Int_t * vNodes, Vec_Int_t * vLeaves, Vec_Int_t ** pvMapInv )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t ** ppCopies;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMaps;
    int i;
//    assert( Vec_IntSize(vLeaves) >= Vec_IntSize(vPPis) );
    Gia_ManCreateRefs( p );
    pNtk = Nwk_ManAlloc();
    pNtk->pName = Abc_UtilStrsav( p->pName );
    pNtk->nFanioPlus = 0;
    Hop_ManStop( pNtk->pManHop );
    pNtk->pManHop = NULL;
    // allocate
    vMaps = Vec_IntAlloc( Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ppCopies = ABC_ALLOC( Nwk_Obj_t *, Gia_ManObjNum(p) );
    // copy objects
    pObj = Gia_ManConst0(p);
//    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) );
    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) + (Vec_IntSize(vLeaves) > Vec_IntSize(vPPis) ? Vec_IntSize(vLeaves) - Vec_IntSize(vPPis) : 0) );
    Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateCi( pNtk, Gia_ObjRefNum(p,pObj) );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    for ( i = Vec_IntSize(vLeaves); i < Vec_IntSize(vPPis); i++ )
    {
        Nwk_ManCreateCi( pNtk, 0 );
        Vec_IntPush( vMaps, -1 );
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 2, Gia_ObjRefNum(p,pObj) );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId0p(p,pObj)] );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId1p(p,pObj)] );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
    {
        assert( ppCopies[Gia_ObjId(p,pObj)] != NULL );
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[Gia_ObjId(p,pObj)] );
    }
    for ( i = Vec_IntSize(vPPis); i < Vec_IntSize(vLeaves); i++ )
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[0] );
    assert( Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ABC_FREE( ppCopies );
    *pvMapInv = vMaps;
    return pNtk;
}